

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O0

void StoreCommands(MemoryManager *m,uint8_t *literals,size_t num_literals,uint32_t *commands,
                  size_t num_commands,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint local_b98;
  uint8_t lit;
  uint32_t j;
  uint32_t insert;
  uint32_t extra;
  uint32_t code_1;
  uint32_t cmd;
  uint32_t code;
  size_t i;
  uint32_t cmd_histo [128];
  uint16_t cmd_bits [128];
  uint8_t cmd_depths [128];
  uint32_t lit_histo [256];
  uint16_t lit_bits [256];
  uint8_t lit_depths [256];
  size_t *storage_ix_local;
  size_t num_commands_local;
  uint32_t *commands_local;
  size_t num_literals_local;
  uint8_t *literals_local;
  MemoryManager *m_local;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  memset(cmd_depths + 0x78,0,0x400);
  memset(cmd_bits + 0x7c,0,0x80);
  memset(cmd_histo + 0x7e,0,0x100);
  memset(&i,0,0x200);
  for (_cmd = 0; _cmd < num_literals; _cmd = _cmd + 1) {
    lit_histo[(ulong)literals[_cmd] - 2] = lit_histo[(ulong)literals[_cmd] - 2] + 1;
  }
  BrotliBuildAndStoreHuffmanTreeFast
            (m,(uint32_t *)(cmd_depths + 0x78),num_literals,8,(uint8_t *)(lit_bits + 0xfc),
             (uint16_t *)(lit_histo + 0xfe),storage_ix,storage);
  for (_cmd = 0; _cmd < num_commands; _cmd = _cmd + 1) {
    cmd_histo[(ulong)(commands[_cmd] & 0xff) - 2] =
         cmd_histo[(ulong)(commands[_cmd] & 0xff) - 2] + 1;
  }
  i._4_4_ = i._4_4_ + 1;
  cmd_histo[0] = cmd_histo[0] + 1;
  cmd_histo[0x3e] = cmd_histo[0x3e] + 1;
  cmd_histo[0x52] = cmd_histo[0x52] + 1;
  BuildAndStoreCommandPrefixCode
            ((uint32_t *)&i,(uint8_t *)(cmd_bits + 0x7c),(uint16_t *)(cmd_histo + 0x7e),storage_ix,
             storage);
  num_literals_local = (size_t)literals;
  for (_cmd = 0; _cmd < num_commands; _cmd = _cmd + 1) {
    uVar4 = commands[_cmd] & 0xff;
    uVar5 = commands[_cmd] >> 8;
    bVar1 = *(byte *)((long)cmd_bits + (ulong)uVar4 + 0xf8);
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)cmd_bits[(ulong)uVar4 - 4] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)bVar1 + *storage_ix;
    uVar2 = StoreCommands::kNumExtraBits[uVar4];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)uVar5 << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)uVar2 + *storage_ix;
    if (uVar4 < 0x18) {
      uVar3 = StoreCommands::kInsertOffset[uVar4];
      for (local_b98 = 0; local_b98 < uVar3 + uVar5; local_b98 = local_b98 + 1) {
        bVar1 = *(byte *)((long)lit_bits + (ulong)*(byte *)num_literals_local + 0x1f8);
        *(ulong *)(storage + (*storage_ix >> 3)) =
             (ulong)lit_bits[(ulong)*(byte *)num_literals_local - 4] << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = (ulong)bVar1 + *storage_ix;
        num_literals_local = num_literals_local + 1;
      }
    }
  }
  return;
}

Assistant:

static void StoreCommands(MemoryManager* m,
                          const uint8_t* literals, const size_t num_literals,
                          const uint32_t* commands, const size_t num_commands,
                          size_t* storage_ix, uint8_t* storage) {
  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  uint8_t lit_depths[256];
  uint16_t lit_bits[256];
  uint32_t lit_histo[256] = { 0 };
  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  size_t i;
  for (i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, lit_histo, num_literals,
                                     /* max_bits = */ 8,
                                     lit_depths, lit_bits,
                                     storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;

  for (i = 0; i < num_commands; ++i) {
    const uint32_t code = commands[i] & 0xFF;
    BROTLI_DCHECK(code < 128);
    ++cmd_histo[code];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xFF;
    const uint32_t extra = cmd >> 8;
    BROTLI_DCHECK(code < 128);
    BrotliWriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    BrotliWriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      uint32_t j;
      for (j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        BrotliWriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}